

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdCountAigNodes(Kit_DsdNtk_t *pNtk)

{
  Kit_DsdObj_t KVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  iVar2 = 0;
  for (uVar3 = 0; pNtk->nNodes != uVar3; uVar3 = uVar3 + 1) {
    KVar1 = *pNtk->pNodes[uVar3];
    uVar4 = (uint)KVar1 >> 6 & 7;
    if (uVar4 == 5) {
      iVar2 = iVar2 + 3;
    }
    else if (uVar4 == 4) {
      iVar2 = iVar2 + ((uint)KVar1 >> 0x1a) * 3 + -3;
    }
    else if (uVar4 == 3) {
      iVar2 = iVar2 + ((uint)KVar1 >> 0x1a) + -1;
    }
  }
  return iVar2;
}

Assistant:

int Kit_DsdCountAigNodes( Kit_DsdNtk_t * pNtk )
{
    Kit_DsdObj_t * pObj;
    int i, Counter = 0;
    for ( i = 0; i < pNtk->nNodes; i++ )
    {
        pObj = pNtk->pNodes[i];
        if ( pObj->Type == KIT_DSD_AND )
            Counter += ((int)pObj->nFans - 1);
        else if ( pObj->Type == KIT_DSD_XOR )
            Counter += ((int)pObj->nFans - 1) * 3;
        else if ( pObj->Type == KIT_DSD_PRIME ) // assuming MUX decomposition
            Counter += 3;
    }
    return Counter;
}